

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

StaticError * __thiscall
jsonnet::internal::anon_unknown_0::Parser::unexpected
          (StaticError *__return_storage_ptr__,Parser *this,Token *tok,string *while_)

{
  char *__s;
  size_t sVar1;
  StaticError *pSVar2;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"unexpected: ",0xc);
  __s = Token::toString(*(Kind *)&this->tokens);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," while ",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,*(char **)tok,
             (long)(tok->fodder).
                   super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::stringbuf::str();
  StaticError::StaticError(__return_storage_ptr__,(LocationRange *)(this + 8),&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  pSVar2 = (StaticError *)std::ios_base::~ios_base(local_130);
  return pSVar2;
}

Assistant:

StaticError unexpected(const Token &tok, const std::string &while_)
    {
        std::stringstream ss;
        ss << "unexpected: " << tok.kind << " while " << while_;
        return StaticError(tok.location, ss.str());
    }